

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O3

PointType __thiscall
CubicInterpolation::at(CubicInterpolation *this,double *t,int *derivative_order)

{
  double *pdVar1;
  Curve<3,_2> CVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ActualDstType actualDst;
  undefined4 *in_RCX;
  long lVar7;
  double in_XMM1_Qa;
  double dVar8;
  PointType PVar9;
  PointType PVar10;
  
  switch(*in_RCX) {
  case 0:
    dVar3 = 0.0;
    dVar4 = 0.0;
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
    in_XMM1_Qa = *(double *)derivative_order;
    dVar8 = 1.0;
    lVar7 = 0;
    do {
      pdVar1 = (double *)((long)t + lVar7 + 0x10);
      dVar3 = dVar3 + dVar8 * *pdVar1;
      dVar4 = dVar4 + dVar8 * pdVar1[1];
      dVar8 = dVar8 * in_XMM1_Qa;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    break;
  case 1:
    dVar3 = *(double *)derivative_order;
    dVar8 = t[7];
    PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         t[6] * 2.0 * dVar3 + t[4];
    dVar4 = t[5];
    dVar6 = t[9];
    (this->super_Curve<3,_2>)._vptr_Curve =
         (_func_int **)
         (t[8] * 3.0 * dVar3 * dVar3 +
         PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [1]);
    (this->super_Curve<3,_2>).length_ = dVar6 * 3.0 * dVar3 * dVar3 + dVar8 * 2.0 * dVar3 + dVar4;
    PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         dVar3;
    return (PointType)
           PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
           array;
  case 2:
    in_XMM1_Qa = t[6] * 2.0;
    dVar3 = *(double *)derivative_order * t[8] * 6.0 + in_XMM1_Qa;
    dVar4 = *(double *)derivative_order * t[9] * 6.0 + t[7] * 2.0;
    break;
  case 3:
    dVar3 = t[8] * 6.0;
    dVar4 = t[9] * 6.0;
    break;
  default:
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_XMM1_Qa;
    return (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)(auVar5 << 0x40);
  }
  CVar2.length_._0_4_ = SUB84(dVar4,0);
  CVar2._vptr_Curve = (_func_int **)dVar3;
  CVar2.length_._4_4_ = (int)((ulong)dVar4 >> 0x20);
  this->super_Curve<3,_2> = CVar2;
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar3;
  return (PointType)
         PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto CubicInterpolation::at(const double& t, const int& derivative_order) const
    -> CubicInterpolation::PointType {
  switch (derivative_order) {
    case 0: {
      PointType point(0.0, 0.0);
      double tpow = 1.0;
      for (const auto& coeff : coeffs_) {
        point += coeff * tpow;
        tpow *= t;
      }
      return point;
    }
    case 1:
      return coeffs_[1] + 2.0 * coeffs_[2] * t + 3.0 * coeffs_[3] * t * t;
    case 2:
      return 2.0 * coeffs_[2] + 6.0 * coeffs_[3] * t;
    case 3:
      return 6.0 * coeffs_[3];
    default:
      return PointType::Zero();
  }
}